

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levels.hpp
# Opt level: O0

char * websocketpp::log::alevel::channel_name(level channel)

{
  level channel_local;
  char *local_8;
  
  if (channel == 1) {
    local_8 = "connect";
  }
  else if (channel == 2) {
    local_8 = "disconnect";
  }
  else if (channel == 4) {
    local_8 = "control";
  }
  else if (channel == 8) {
    local_8 = "frame_header";
  }
  else if (channel == 0x10) {
    local_8 = "frame_payload";
  }
  else if (channel == 0x20) {
    local_8 = "message_header";
  }
  else if (channel == 0x40) {
    local_8 = "message_payload";
  }
  else if (channel == 0x80) {
    local_8 = "endpoint";
  }
  else if (channel == 0x100) {
    local_8 = "debug_handshake";
  }
  else if (channel == 0x200) {
    local_8 = "debug_close";
  }
  else if (channel == 0x400) {
    local_8 = "devel";
  }
  else if (channel == 0x800) {
    local_8 = "application";
  }
  else if (channel == 0x1000) {
    local_8 = "http";
  }
  else if (channel == 0x2000) {
    local_8 = "fail";
  }
  else {
    local_8 = "unknown";
  }
  return local_8;
}

Assistant:

static char const * channel_name(level channel) {
        switch(channel) {
            case connect:
                return "connect";
            case disconnect:
                return "disconnect";
            case control:
                return "control";
            case frame_header:
                return "frame_header";
            case frame_payload:
                return "frame_payload";
            case message_header:
                return "message_header";
            case message_payload:
                return "message_payload";
            case endpoint:
                return "endpoint";
            case debug_handshake:
                return "debug_handshake";
            case debug_close:
                return "debug_close";
            case devel:
                return "devel";
            case app:
                return "application";
            case http:
                return "http";
            case fail:
                return "fail";
            default:
                return "unknown";
        }
    }